

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<tinyusdz::value::normal3f>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,normal3f *v)

{
  float fVar1;
  bool bVar2;
  pointer pSVar3;
  value_type *pvVar4;
  pointer pSVar5;
  optional<tinyusdz::value::normal3f> pv;
  optional<tinyusdz::value::normal3f> local_48;
  double local_38;
  optional<tinyusdz::value::normal3f> local_30;
  
  if (v == (normal3f *)0x0) {
    return false;
  }
  if (NAN(t)) {
    local_38 = t;
    get_default_value<tinyusdz::value::normal3f>(&local_48,this);
    local_30.has_value_ = local_48.has_value_;
    if (local_48.has_value_ == true) goto LAB_001c072a;
    pSVar3 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar5 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    t = local_38;
    if (pSVar3 == pSVar5) {
      return false;
    }
  }
  else {
    pSVar3 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar5 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (pSVar5 != pSVar3) {
    bVar2 = tinyusdz::value::TimeSamples::get<tinyusdz::value::normal3f,_nullptr>
                      (&this->_ts,v,t,tinterp);
    return bVar2;
  }
  bVar2 = has_value(this);
  if (bVar2) {
    get_default_value<tinyusdz::value::normal3f>(&local_48,this);
    local_30.has_value_ = local_48.has_value_;
    if (local_48.has_value_ != false) {
LAB_001c072a:
      local_30.contained._8_4_ = local_48.contained._8_4_;
      local_30.contained._0_8_ = local_48.contained._0_8_;
      pvVar4 = nonstd::optional_lite::optional<tinyusdz::value::normal3f>::value(&local_30);
      fVar1 = pvVar4->y;
      v->x = pvVar4->x;
      v->y = fVar1;
      v->z = pvVar4->z;
      return true;
    }
  }
  return false;
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }